

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::SimpleCompute::Setup(SimpleCompute *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  bool *compile_error;
  long lVar3;
  GLint v [3];
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "\nlayout(local_size_x = 1, local_size_y = 1) in;\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
             ,"");
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_38);
  this->m_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar3 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGetProgramiv(this_00,this->m_program,0x8267,(GLint *)&local_38);
    if ((int)local_38._M_string_length == 1 &&
        (local_38._M_dataplus._M_p._4_4_ == 1 && (int)local_38._M_dataplus._M_p == 1)) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
      lVar3 = 0;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    }
    else {
      anon_unknown_0::Output
                ("Got %d, %d, %d, expected: 1, 1, 1 in GL_COMPUTE_WORK_GROUP_SIZE check");
      lVar3 = -1;
    }
  }
  return lVar3;
}

Assistant:

virtual long Setup()
	{

		const char* const glsl_cs =
			NL "layout(local_size_x = 1, local_size_y = 1) in;" NL "layout(std430) buffer Output {" NL "  vec4 data;" NL
			   "} g_out;" NL "void main() {" NL "  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		GLint v[3];
		glGetProgramiv(m_program, GL_COMPUTE_WORK_GROUP_SIZE, v);
		if (v[0] != 1 || v[1] != 1 || v[2] != 1)
		{
			Output("Got %d, %d, %d, expected: 1, 1, 1 in GL_COMPUTE_WORK_GROUP_SIZE check", v[0], v[1], v[2]);
			return ERROR;
		}

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return NO_ERROR;
	}